

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean flush_bits_s(working_state *state)

{
  boolean bVar1;
  working_state *state_local;
  
  bVar1 = emit_bits_s(state,0x7f,7);
  if (bVar1 != 0) {
    (state->cur).put_buffer = 0;
    (state->cur).put_bits = 0;
  }
  state_local._4_4_ = (uint)(bVar1 != 0);
  return state_local._4_4_;
}

Assistant:

LOCAL(boolean)
flush_bits_s (working_state * state)
{
  if (! emit_bits_s(state, 0x7F, 7)) /* fill any partial byte with ones */
    return FALSE;
  state->cur.put_buffer = 0;	     /* and reset bit-buffer to empty */
  state->cur.put_bits = 0;
  return TRUE;
}